

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  int in_EAX;
  uint uVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  undefined1 uVar10;
  uint uVar11;
  int iVar12;
  byte *local_40;
  char *local_38;
  
  lVar6 = (long)end - (long)ptr;
  if (lVar6 < 2) {
    return -1;
  }
  local_38 = end + -2;
  local_40 = (byte *)ptr;
LAB_003b6414:
  bVar2 = local_40[1];
  if (bVar2 < 0xdc) {
    uVar10 = 7;
    if (3 < bVar2 - 0xd8) {
      if (bVar2 == 0) {
        uVar10 = *(undefined1 *)((long)enc[1].scanners + (ulong)*local_40);
      }
      else {
LAB_003b6462:
        uVar10 = 0x1d;
      }
    }
  }
  else if (bVar2 - 0xdc < 4) {
    uVar10 = 8;
  }
  else {
    if ((bVar2 != 0xff) || (*local_40 < 0xfe)) goto LAB_003b6462;
    uVar10 = 0;
  }
  switch(uVar10) {
  case 6:
    if (lVar6 == 2) {
      return -2;
    }
    break;
  case 7:
    if (lVar6 < 4) {
      return -2;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    lVar6 = (long)local_38 - (long)local_40;
    pbVar1 = local_40;
    do {
      local_40 = pbVar1 + 2;
      iVar8 = 1;
      if (lVar6 < 2) {
        in_EAX = -1;
      }
      else {
        bVar2 = pbVar1[3];
        if (bVar2 < 0xdc) {
          uVar11 = 7;
          if (3 < bVar2 - 0xd8) {
            if (bVar2 == 0) {
              uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_40);
            }
            else {
LAB_003b64fe:
              uVar11 = 0x1d;
            }
          }
        }
        else if (bVar2 - 0xdc < 4) {
          uVar11 = 8;
        }
        else if ((bVar2 != 0xff) || (uVar11 = 0, *local_40 < 0xfe)) goto LAB_003b64fe;
        iVar8 = 5;
        if ((uVar11 != 0xe) &&
           ((0x15 < uVar11 || (iVar8 = 0, (0x200600U >> (uVar11 & 0x1f) & 1) == 0)))) {
          *nextTokPtr = (char *)local_40;
          in_EAX = 0;
          iVar8 = 1;
        }
      }
      lVar6 = lVar6 + -2;
      pbVar1 = local_40;
    } while (iVar8 == 0);
    if (iVar8 == 1) {
      return in_EAX;
    }
  case 0xe:
    local_40 = local_40 + 2;
    for (lVar6 = (long)end - (long)local_40; 1 < lVar6; lVar6 = lVar6 + -2) {
      bVar2 = local_40[1];
      if (bVar2 < 0xdc) {
        uVar11 = 7;
        if (3 < bVar2 - 0xd8) {
          if (bVar2 == 0) {
            uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_40);
          }
          else {
LAB_003b65b0:
            uVar11 = 0x1d;
          }
        }
      }
      else if (bVar2 - 0xdc < 4) {
        uVar11 = 8;
      }
      else if ((bVar2 != 0xff) || (uVar11 = 0, *local_40 < 0xfe)) goto LAB_003b65b0;
      if ((uVar11 & 0xfffffffe) == 0xc) {
        local_40 = local_40 + 2;
        goto LAB_003b662d;
      }
      if ((0x15 < uVar11) || ((0x200600U >> (uVar11 & 0x1f) & 1) == 0)) {
        *nextTokPtr = (char *)local_40;
        in_EAX = 0;
        goto LAB_003b65f1;
      }
      local_40 = local_40 + 2;
    }
    in_EAX = -1;
LAB_003b65f1:
    bVar3 = true;
    goto LAB_003b6987;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_003b647c_caseD_16;
  case 0x1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(*local_40 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5))
         >> (*local_40 & 0x1f) & 1) == 0) break;
    goto switchD_003b647c_caseD_16;
  }
  *nextTokPtr = (char *)local_40;
  return 0;
switchD_003b647c_caseD_16:
  local_40 = local_40 + 2;
  goto LAB_003b698b;
LAB_003b662d:
  do {
    lVar6 = (long)end - (long)local_40;
    iVar8 = -1;
    if (lVar6 < 2) {
LAB_003b66bc:
      bVar3 = true;
      iVar12 = 1;
      goto LAB_003b66d4;
    }
    bVar2 = local_40[1];
    if (bVar2 < 0xdc) {
      uVar4 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          uVar4 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_40);
        }
        else {
LAB_003b6694:
          uVar4 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      uVar4 = 8;
    }
    else if ((bVar2 != 0xff) || (uVar4 = 0, *local_40 < 0xfe)) goto LAB_003b6694;
    if (uVar4 == uVar11) {
      iVar12 = 0xb;
LAB_003b66d2:
      bVar3 = false;
      iVar8 = in_EAX;
    }
    else {
      switch(uVar4) {
      case 0:
      case 1:
      case 2:
      case 8:
        *nextTokPtr = (char *)local_40;
        iVar8 = 0;
        goto LAB_003b66bc;
      case 3:
        iVar5 = little2_scanRef(enc,(char *)(local_40 + 2),end,(char **)&local_40);
        bVar3 = false;
        iVar12 = 0;
        iVar8 = in_EAX;
        if (iVar5 < 1) {
          if (iVar5 == 0) {
            *nextTokPtr = (char *)local_40;
          }
          bVar3 = true;
          iVar12 = 1;
          iVar8 = iVar5;
        }
        break;
      default:
        local_40 = local_40 + 2;
LAB_003b66c9:
        iVar12 = 0;
        goto LAB_003b66d2;
      case 6:
        bVar3 = true;
        iVar12 = 1;
        iVar8 = -2;
        if (lVar6 != 2) {
          local_40 = local_40 + 3;
          goto LAB_003b66c9;
        }
        break;
      case 7:
        bVar3 = true;
        iVar12 = 1;
        iVar8 = -2;
        if (3 < lVar6) {
          local_40 = local_40 + 4;
          goto LAB_003b66c9;
        }
      }
    }
LAB_003b66d4:
    in_EAX = iVar8;
  } while (iVar12 == 0);
  if (iVar12 != 0xb) goto LAB_003b6987;
  pbVar1 = local_40 + 2;
  bVar3 = true;
  if ((long)end - (long)pbVar1 < 2) {
LAB_003b697b:
    local_40 = pbVar1;
    in_EAX = -1;
  }
  else {
    bVar2 = local_40[3];
    if (bVar2 < 0xdc) {
      bVar7 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          bVar7 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar1);
        }
        else {
LAB_003b6808:
          bVar7 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      bVar7 = 8;
    }
    else {
      if ((bVar2 != 0xff) || (*pbVar1 < 0xfe)) goto LAB_003b6808;
      bVar7 = 0;
    }
    if (bVar7 < 0x11) {
      if (bVar7 - 9 < 2) {
LAB_003b684d:
        local_40 = local_40 + 4;
        uVar9 = (long)end - (long)local_40;
        pbVar1 = local_40;
        if (1 < (long)uVar9) {
LAB_003b6866:
          bVar2 = local_40[1];
          if (bVar2 < 0xdc) {
            uVar10 = 7;
            if (3 < bVar2 - 0xd8) {
              if (bVar2 == 0) {
                uVar10 = *(undefined1 *)((long)enc[1].scanners + (ulong)*local_40);
              }
              else {
LAB_003b68c6:
                uVar10 = 0x1d;
              }
            }
          }
          else if (bVar2 - 0xdc < 4) {
            uVar10 = 8;
          }
          else {
            if ((bVar2 != 0xff) || (*local_40 < 0xfe)) goto LAB_003b68c6;
            uVar10 = 0;
          }
          pbVar1 = local_40;
          switch(uVar10) {
          default:
            goto LAB_003b69a2;
          case 6:
            in_EAX = -2;
            if (uVar9 == 2) goto LAB_003b6987;
            goto LAB_003b69a2;
          case 7:
            in_EAX = -2;
            if (uVar9 < 4) goto LAB_003b6987;
            goto LAB_003b69a2;
          case 9:
          case 10:
          case 0x15:
            goto switchD_003b68dc_caseD_9;
          case 0xb:
            goto LAB_003b6825;
          case 0x11:
            goto LAB_003b6948;
          case 0x16:
          case 0x18:
            break;
          case 0x1d:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(*local_40 >> 3 & 0x1c |
                                 (uint)"\x02\x03\x04\x05\x06\a\b"[local_40[1]] << 5)) >>
                 (*local_40 & 0x1f) & 1) == 0) {
              *nextTokPtr = (char *)local_40;
              in_EAX = 0;
              bVar3 = true;
              goto LAB_003b6987;
            }
          }
          local_40 = local_40 + 2;
          bVar3 = false;
          goto LAB_003b6987;
        }
        goto LAB_003b697b;
      }
      local_40 = pbVar1;
      if (bVar7 == 0xb) {
LAB_003b6825:
        *nextTokPtr = (char *)(local_40 + 2);
        in_EAX = 1;
        goto LAB_003b6987;
      }
    }
    else if (bVar7 == 0x11) {
LAB_003b6948:
      local_40 = pbVar1;
      pbVar1 = local_40 + 2;
      if ((long)end - (long)pbVar1 < 2) goto LAB_003b697b;
      if ((local_40[3] == 0) && (*pbVar1 == 0x3e)) {
        *nextTokPtr = (char *)(local_40 + 4);
        in_EAX = 3;
        local_40 = pbVar1;
        goto LAB_003b6987;
      }
    }
    else if (bVar7 == 0x15) goto LAB_003b684d;
LAB_003b69a2:
    local_40 = pbVar1;
    *nextTokPtr = (char *)local_40;
    in_EAX = 0;
  }
LAB_003b6987:
  if (bVar3) {
    return in_EAX;
  }
LAB_003b698b:
  lVar6 = (long)end - (long)local_40;
  if (lVar6 < 2) {
    return -1;
  }
  goto LAB_003b6414;
switchD_003b68dc_caseD_9:
  local_40 = local_40 + 2;
  uVar9 = uVar9 - 2;
  pbVar1 = local_40;
  if ((long)uVar9 < 2) goto LAB_003b697b;
  goto LAB_003b6866;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          REQUIRE_CHAR(enc, ptr, end);
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            REQUIRE_CHAR(enc, ptr, end);
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}